

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

void __thiscall nivalis::Plotter::begin_slider_animation(Plotter *this,size_t idx)

{
  iterator __position;
  rep rVar1;
  unsigned_long local_10;
  
  if ((this->sliders).super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>.
      _M_impl.super__Vector_impl_data._M_start[idx].animation_dir == 0) {
    local_10 = idx;
    if ((this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      rVar1 = std::chrono::_V2::system_clock::now();
      (this->slider_animation_prev_time).__d.__r = rVar1;
    }
    (this->sliders).super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>.
    _M_impl.super__Vector_impl_data._M_start[local_10].animation_dir = 1;
    __position._M_current =
         (this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->animating_sliders,
                 __position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      (this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->require_update = true;
  }
  return;
}

Assistant:

void Plotter::begin_slider_animation(size_t idx) {
    if (sliders[idx].animation_dir == 0) {
        if (animating_sliders.empty()) {
            slider_animation_prev_time =
                std::chrono::high_resolution_clock::now();
        }
        sliders[idx].animation_dir = 1;
        animating_sliders.push_back(idx);
        require_update = true;
    }
}